

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char cVar1;
  char *pcVar2;
  int patternLength;
  bool bVar3;
  bool bVar4;
  
  skipSpaces(this);
  pcVar2 = this->current_;
  token->start_ = pcVar2;
  if (pcVar2 == this->end_) {
LAB_00120940:
    token->type_ = tokenEndOfStream;
    goto LAB_00120943;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\"':
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_001209d0;
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '(':
  case ')':
  case '*':
  case '+':
  case '.':
    goto switchD_001208ef_caseD_23;
  case ',':
    token->type_ = tokenArraySeparator;
    break;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this);
    break;
  case '/':
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_001209d0:
    bVar3 = true;
    if (bVar4 == false) {
switchD_001208ef_caseD_23:
      token->type_ = tokenError;
      bVar3 = false;
    }
    goto LAB_00120945;
  case ':':
    token->type_ = tokenMemberSeparator;
    break;
  default:
    if (cVar1 == '\0') goto LAB_00120940;
    if (cVar1 == '[') {
      token->type_ = tokenArrayBegin;
    }
    else {
      if (cVar1 != ']') {
        if (cVar1 == 'f') {
          token->type_ = tokenFalse;
          pcVar2 = "false";
          patternLength = 4;
        }
        else {
          if (cVar1 == 'n') {
            token->type_ = tokenNull;
            pcVar2 = "null";
          }
          else {
            if (cVar1 != 't') {
              if (cVar1 == '}') {
                token->type_ = tokenObjectEnd;
              }
              else {
                if (cVar1 != '{') goto switchD_001208ef_caseD_23;
                token->type_ = tokenObjectBegin;
              }
              break;
            }
            token->type_ = tokenTrue;
            pcVar2 = "true";
          }
          patternLength = 3;
        }
        bVar4 = match(this,pcVar2 + 1,patternLength);
        goto LAB_001209d0;
      }
      token->type_ = tokenArrayEnd;
    }
  }
LAB_00120943:
  bVar3 = true;
LAB_00120945:
  token->end_ = this->current_;
  return bVar3;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}